

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

unsigned_long __thiscall
fakeit::RepeatForever<unsigned_long>::invoke
          (RepeatForever<unsigned_long> *this,ArgumentsTuple<> *args)

{
  unsigned_long uVar1;
  function<unsigned_long_()> local_30;
  
  std::function<unsigned_long_()>::function(&local_30,&this->f);
  uVar1 = TupleDispatcher::invoke<unsigned_long>(&local_30,args);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return uVar1;
}

Assistant:

virtual R invoke(const ArgumentsTuple<arglist...> & args) override {
            return TupleDispatcher::invoke<R, arglist...>(f, args);
        }